

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

void __thiscall FDynamicColormap::BuildLights(FDynamicColormap *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE *pBVar4;
  BYTE BVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint32 uVar11;
  PalEntry *local_878;
  PalEntry *local_858;
  int intensity;
  int b;
  int g;
  int r;
  BYTE *shade;
  PalEntry basecolors [256];
  PalEntry colors [256];
  int local_28;
  int ild;
  int ld;
  int lb;
  int lg;
  int lr;
  int c;
  int l;
  FDynamicColormap *this_local;
  
  local_858 = basecolors + 0xfe;
  do {
    PalEntry::PalEntry(local_858);
    local_858 = local_858 + 1;
  } while (local_858 != colors + 0xfe);
  local_878 = (PalEntry *)&shade;
  do {
    PalEntry::PalEntry(local_878);
    local_878 = local_878 + 1;
  } while (local_878 != basecolors + 0xfe);
  if (this->Maps != (BYTE *)0x0) {
    bVar1 = (this->Color).field_0.field_0.r;
    bVar2 = (this->Color).field_0.field_0.g;
    bVar3 = (this->Color).field_0.field_0.b;
    local_28 = (this->Desaturate << 8) / 0xff;
    if (local_28 < 0) {
      local_28 = -local_28;
    }
    iVar6 = 0x100 - local_28;
    if (local_28 == 0) {
      memcpy(&shade,&GPalette,0x400);
    }
    else {
      for (lg = 0; lg < 0x100; lg = lg + 1) {
        uVar7 = (uint)GPalette.BaseColors[lg].field_0.field_0.r;
        uVar8 = (uint)GPalette.BaseColors[lg].field_0.field_0.g;
        uVar9 = (uint)GPalette.BaseColors[lg].field_0.field_0.b;
        iVar10 = ((int)(uVar7 * 0x4d + uVar8 * 0x8f + uVar9 * 0x25) >> 8) * local_28;
        basecolors[(long)lg + -2].field_0.field_0.r = (BYTE)(uVar7 * iVar6 + iVar10 >> 8);
        basecolors[(long)lg + -2].field_0.field_0.g = (BYTE)(uVar8 * iVar6 + iVar10 >> 8);
        basecolors[(long)lg + -2].field_0.field_0.b = (BYTE)(uVar9 * iVar6 + iVar10 >> 8);
        basecolors[(long)lg + -2].field_0.field_0.a = '\0';
      }
    }
    for (lr = 0; lr < 0x20; lr = lr + 1) {
      DoBlending((PalEntry *)&shade,basecolors + 0xfe,0x100,(uint)(this->Fade).field_0.field_0.r,
                 (uint)(this->Fade).field_0.field_0.g,(uint)(this->Fade).field_0.field_0.b,lr << 3);
      pBVar4 = this->Maps;
      uVar11 = PalEntry::operator_cast_to_unsigned_int(&this->Color);
      _g = pBVar4 + (lr << 8);
      if (uVar11 == 0xffffff) {
        for (lg = 0; lg < 0x100; lg = lg + 1) {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,
                                      (uint)basecolors[(long)lg + 0xfe].field_0.field_0.r,
                                      (uint)basecolors[(long)lg + 0xfe].field_0.field_0.g,
                                      (uint)basecolors[(long)lg + 0xfe].field_0.field_0.b);
          *_g = BVar5;
          _g = _g + 1;
        }
      }
      else {
        for (lg = 0; lg < 0x100; lg = lg + 1) {
          BVar5 = FColorMatcher::Pick(&ColorMatcher,
                                      (int)((uint)basecolors[(long)lg + 0xfe].field_0.field_0.r *
                                           (((uint)bVar1 << 8) / 0xff)) >> 8,
                                      (int)((uint)basecolors[(long)lg + 0xfe].field_0.field_0.g *
                                           (((uint)bVar2 << 8) / 0xff)) >> 8,
                                      (int)((uint)basecolors[(long)lg + 0xfe].field_0.field_0.b *
                                           (((uint)bVar3 << 8) / 0xff)) >> 8);
          *_g = BVar5;
          _g = _g + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void FDynamicColormap::BuildLights ()
{
	int l, c;
	int lr, lg, lb, ld, ild;
	PalEntry colors[256], basecolors[256];
	BYTE *shade;

	if (Maps == NULL)
		return;

	// Scale light to the range 0-256, so we can avoid
	// dividing by 255 in the bottom loop.
	lr = Color.r*256/255;
	lg = Color.g*256/255;
	lb = Color.b*256/255;
	ld = Desaturate*256/255;
	if (ld < 0)	// No negative desaturations, please.
	{
		ld = -ld;
	}
	ild = 256-ld;

	if (ld == 0)
	{
		memcpy (basecolors, GPalette.BaseColors, sizeof(basecolors));
	}
	else
	{
		// Desaturate the palette before lighting it.
		for (c = 0; c < 256; c++)
		{
			int r = GPalette.BaseColors[c].r;
			int g = GPalette.BaseColors[c].g;
			int b = GPalette.BaseColors[c].b;
			int intensity = ((r * 77 + g * 143 + b * 37) >> 8) * ld;
			basecolors[c].r = (r*ild + intensity) >> 8;
			basecolors[c].g = (g*ild + intensity) >> 8;
			basecolors[c].b = (b*ild + intensity) >> 8;
			basecolors[c].a = 0;
		}
	}

	// build normal (but colored) light mappings
	for (l = 0; l < NUMCOLORMAPS; l++)
	{
		DoBlending (basecolors, colors, 256,
			Fade.r, Fade.g, Fade.b, l * (256 / NUMCOLORMAPS));

		shade = Maps + 256*l;
		if ((DWORD)Color == MAKERGB(255,255,255))
		{ // White light, so we can just pick the colors directly
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (colors[c].r, colors[c].g, colors[c].b);
			}
		}
		else
		{ // Colored light, so do the (slightly) slower thing
			for (c = 0; c < 256; c++)
			{
				*shade++ = ColorMatcher.Pick (
					(colors[c].r*lr)>>8,
					(colors[c].g*lg)>>8,
					(colors[c].b*lb)>>8);
			}
		}
	}
}